

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitio.cpp
# Opt level: O0

ssize_t __thiscall
bitio::bitio_stream::read(bitio_stream *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  byte bVar2;
  char local_2a;
  char rembits;
  char nbytes;
  ulong uStack_28;
  char target_bits;
  uint64_t value;
  uint8_t n_local;
  bitio_stream *this_local;
  
  bVar1 = (byte)__fd;
  if (bVar1 == 0) {
    this_local = (bitio_stream *)0x0;
  }
  else {
    if (this->bit_count == '\0') {
      load_byte(this);
      this->bit_count = '\b';
    }
    if (this->bit_count < bVar1) {
      uStack_28 = (ulong)((int)(uint)this->bit_buffer >> (8 - this->bit_count & 0x1f));
      bVar2 = bVar1 - this->bit_count;
      this->bit_buffer = '\0';
      this->bit_count = '\0';
      local_2a = (char)bVar2 >> 3;
      while (local_2a != '\0') {
        load_byte(this);
        uStack_28 = (ulong)this->bit_buffer + uStack_28 * 0x100;
        local_2a = local_2a + -1;
      }
      load_byte(this);
      this->bit_count = '\b';
      bVar2 = bVar2 & 7;
      uStack_28 = (long)((int)(uint)(this->bit_buffer & reverse_bit_masks[(char)bVar2]) >>
                        (8 - bVar2 & 0x1f)) + (uStack_28 << bVar2);
      this->bit_buffer = this->bit_buffer << bVar2;
      this->bit_count = this->bit_count - bVar2;
    }
    else {
      uStack_28 = (ulong)((int)(uint)(this->bit_buffer & reverse_bit_masks[bVar1]) >>
                         (8 - bVar1 & 0x1f));
      this->bit_buffer = this->bit_buffer << (bVar1 & 0x1f);
      this->bit_count = this->bit_count - bVar1;
    }
    this_local = (bitio_stream *)(uStack_28 & *(ulong *)(ui64_masks + (ulong)bVar1 * 8));
  }
  return (ssize_t)this_local;
}

Assistant:

uint64_t bitio_stream::read(uint8_t n) {
    if (n == 0) {
        return 0;
    }

    uint64_t value = 0;
    if (bit_count == 0) {
        load_byte();
        bit_count = 8;
    }

    if (bit_count >= n) {
        value += (bit_buffer & reverse_bit_masks[n]) >> (8 - n);
        bit_buffer <<= n;
        bit_count -= n;
    } else {
        value += bit_buffer >> (8 - bit_count);
        char target_bits = n - bit_count;
        char nbytes = target_bits >> 3;
        bit_buffer = 0;
        bit_count = 0;

        while (nbytes--) {
            load_byte();
            value <<= 8;
            value += bit_buffer;
        }
        load_byte();
        bit_count = 8;

        char rembits = target_bits & bit_masks[3];

        value <<= rembits;
        value += (bit_buffer & reverse_bit_masks[rembits]) >> (8 - rembits);
        bit_buffer <<= rembits;
        bit_count -= rembits;
    }
    return value & ui64_masks[n];
}